

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::ModAsyncify<true,_false,_true>::ModAsyncify(ModAsyncify<true,_false,_true> *this)

{
  ModAsyncify<true,_false,_true> *this_local;
  
  WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__ModAsyncify_02716080;
  wasm::Name::Name(&this->asyncifyStateName);
  this->unwinding = false;
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }